

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_>_>_> *fadexpr)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Fad<double> *pFVar5;
  double *pdVar6;
  Fad<double> *pFVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *pFVar13;
  
  pFVar13 = (fadexpr->fadexpr_).expr_;
  pFVar7 = (pFVar13->fadexpr_).left_;
  uVar8 = (pFVar7->dx_).num_elts;
  uVar2 = (((pFVar13->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar8) {
    uVar2 = uVar8;
  }
  uVar3 = (this->dx_).num_elts;
  if (uVar2 == uVar3) {
    if (uVar2 == 0) goto LAB_00e0545d;
    pdVar6 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar2 == 0) {
      if (uVar3 != 0) {
        pdVar6 = (this->dx_).ptr_to_data;
        if (pdVar6 != (double *)0x0) {
          operator_delete__(pdVar6);
          pFVar13 = (fadexpr->fadexpr_).expr_;
          pFVar7 = (pFVar13->fadexpr_).left_;
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00e0545d;
    }
    if (uVar3 != 0) {
      pdVar6 = (this->dx_).ptr_to_data;
      if (pdVar6 != (double *)0x0) {
        operator_delete__(pdVar6);
        pFVar13 = (fadexpr->fadexpr_).expr_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar2;
    uVar9 = 0xffffffffffffffff;
    if (-1 < (int)uVar2) {
      uVar9 = (ulong)uVar2 << 3;
    }
    pdVar6 = (double *)operator_new__(uVar9);
    (this->dx_).ptr_to_data = pdVar6;
    pFVar7 = (pFVar13->fadexpr_).left_;
    uVar8 = (pFVar7->dx_).num_elts;
  }
  if ((uVar8 == 0) || (pFVar5 = (pFVar13->fadexpr_).right_, (pFVar5->dx_).num_elts == 0)) {
    if (0 < (int)uVar2) {
      pFVar5 = (pFVar13->fadexpr_).right_;
      iVar4 = (pFVar5->dx_).num_elts;
      uVar9 = (ulong)uVar2;
      lVar10 = 0;
      do {
        pdVar12 = (double *)((long)(pFVar7->dx_).ptr_to_data + lVar10);
        if (uVar8 == 0) {
          pdVar12 = &pFVar7->defaultVal;
        }
        dVar1 = pFVar5->val_;
        pdVar11 = (double *)((long)(pFVar5->dx_).ptr_to_data + lVar10);
        if (iVar4 == 0) {
          pdVar11 = &pFVar5->defaultVal;
        }
        *(double *)((long)pdVar6 + lVar10) =
             -(*pdVar12 * dVar1 - pFVar7->val_ * *pdVar11) / (dVar1 * dVar1);
        lVar10 = lVar10 + 8;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  else if (0 < (int)uVar2) {
    pdVar12 = (pFVar7->dx_).ptr_to_data;
    pdVar11 = (pFVar5->dx_).ptr_to_data;
    uVar9 = 0;
    do {
      dVar1 = pFVar5->val_;
      pdVar6[uVar9] = -(pdVar12[uVar9] * dVar1 - pFVar7->val_ * pdVar11[uVar9]) / (dVar1 * dVar1);
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
LAB_00e0545d:
  this->val_ = -pFVar7->val_ / ((pFVar13->fadexpr_).right_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}